

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O1

void __thiscall Cleaner::Remove(Cleaner *this,string *path)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->removed_)._M_t,path);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->removed_)._M_t._M_impl.super__Rb_tree_header) {
    pVar4 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&this->removed_,path);
    if (this->config_->dry_run == true) {
      bVar1 = FileExists(this,path);
      if (bVar1) {
LAB_00110505:
        Report(this,path);
        return;
      }
    }
    else {
      iVar2 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[8])
                        (this->disk_interface_,path,pVar4._8_8_);
      if (iVar2 == -1) {
        this->status_ = 1;
      }
      else if (iVar2 == 0) goto LAB_00110505;
    }
  }
  return;
}

Assistant:

void Cleaner::Remove(const string& path) {
  if (!IsAlreadyRemoved(path)) {
    removed_.insert(path);
    if (config_.dry_run) {
      if (FileExists(path))
        Report(path);
    } else {
      int ret = RemoveFile(path);
      if (ret == 0)
        Report(path);
      else if (ret == -1)
        status_ = 1;
    }
  }
}